

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_TestShell::
~TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_TestShell
          (TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToFirstOne_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCallsList, removeAllExpectationsExceptThisThatRelateToFirstOne)
{
    call1->withName("relate");
    call2->withName("unrelate");
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    list->onlyKeepExpectationsRelatedTo("unrelate");
    LONGS_EQUAL(1, list->size());
}